

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

int despot::util::tinyxml::TiXmlBase::IsAlphaNum(uchar anyByte,TiXmlEncoding param_2)

{
  TiXmlEncoding param_1_local;
  uchar anyByte_local;
  
  if (anyByte < 0x7f) {
    param_1_local = isalnum((uint)anyByte);
  }
  else {
    param_1_local = TIXML_ENCODING_UTF8;
  }
  return param_1_local;
}

Assistant:

int TiXmlBase::IsAlphaNum(unsigned char anyByte,
	TiXmlEncoding /*encoding*/) {
	// This will only work for low-ascii, everything else is assumed to be a valid
	// letter. I'm not sure this is the best approach, but it is quite tricky trying
	// to figure out alhabetical vs. not across encoding. So take a very
	// conservative approach.

	//	if ( encoding == TIXML_ENCODING_UTF8 )
	//	{
	if (anyByte < 127)
		return isalnum(anyByte);
	else
		return 1; // What else to do? The unicode set is huge...get the english ones right.
	//	}
	//	else
	//	{
	//		return isalnum( anyByte );
	//	}
}